

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_graph_reset(ggml_cgraph *cgraph)

{
  _Bool _Var1;
  ggml_tensor *tensor;
  void *in_RDI;
  float onef;
  ggml_tensor *unaff_retaddr;
  ggml_tensor *grad_acc;
  ggml_tensor *node;
  int i;
  ggml_tensor *node_00;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  if (*(long *)((long)in_RDI + 0x18) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x17bc,"GGML_ASSERT(%s) failed","cgraph->grads != NULL");
  }
  iVar2 = 0;
  do {
    if (*(int *)((long)in_RDI + 4) <= iVar2) {
      return;
    }
    node_00 = *(ggml_tensor **)(*(long *)((long)in_RDI + 0x10) + (long)iVar2 * 8);
    tensor = ggml_graph_get_grad_acc
                       ((ggml_cgraph *)CONCAT44(iVar2,in_stack_fffffffffffffff0),node_00);
    if (node_00->op == GGML_OP_OPT_STEP_ADAMW) {
      ggml_set_zero(node_00);
      ggml_set_zero(node_00);
    }
    if (tensor != (ggml_tensor *)0x0) {
      if ((node_00->flags & 8U) == 0) {
        ggml_set_zero(node_00);
      }
      else {
        if (tensor->type != GGML_TYPE_F32) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c"
                     ,0x17cb,"GGML_ASSERT(%s) failed","grad_acc->type == GGML_TYPE_F32");
        }
        _Var1 = ggml_is_scalar(tensor);
        if (!_Var1) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c"
                     ,0x17cc,"GGML_ASSERT(%s) failed","ggml_is_scalar(grad_acc)");
        }
        if (tensor->buffer == (ggml_backend_buffer *)0x0) {
          if (tensor->data == (void *)0x0) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c"
                       ,0x17d2,"GGML_ASSERT(%s) failed","grad_acc->data");
          }
          *(undefined4 *)tensor->data = 0x3f800000;
        }
        else {
          ggml_backend_tensor_set
                    (unaff_retaddr,in_RDI,CONCAT44(iVar2,in_stack_fffffffffffffff0),(size_t)node_00)
          ;
        }
      }
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void ggml_graph_reset(struct ggml_cgraph * cgraph) {
    GGML_ASSERT(cgraph->grads != NULL);

    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * node     = cgraph->nodes[i];
        struct ggml_tensor * grad_acc = ggml_graph_get_grad_acc(cgraph, node);

        if (node->op == GGML_OP_OPT_STEP_ADAMW) {
            // clear momenta
            ggml_set_zero(node->src[2]);
            ggml_set_zero(node->src[3]);
        }

        // initial gradients of loss should be 1, 0 otherwise
        if (grad_acc) {
            if (node->flags & GGML_TENSOR_FLAG_LOSS) {
                GGML_ASSERT(grad_acc->type == GGML_TYPE_F32);
                GGML_ASSERT(ggml_is_scalar(grad_acc));

                const float onef = 1.0f;
                if (grad_acc->buffer) {
                    ggml_backend_tensor_set(grad_acc, &onef, 0, sizeof(float));
                } else {
                    GGML_ASSERT(grad_acc->data);
                    *((float *) grad_acc->data) = onef;
                }
            } else {
                ggml_set_zero(grad_acc);
            }
        }
    }
}